

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O0

int fwrite_xattr(CURL *curl,int fd)

{
  char *__name;
  char *__value;
  int iVar1;
  size_t __size;
  bool bVar2;
  _Bool local_2d;
  _Bool freeptr;
  char *pcStack_28;
  CURLcode result;
  char *value;
  int local_18;
  int err;
  int i;
  int fd_local;
  CURL *curl_local;
  
  local_18 = 0;
  value._4_4_ = 0;
  err = fd;
  _i = curl;
  while( true ) {
    bVar2 = false;
    if (value._4_4_ == 0) {
      bVar2 = mappings[local_18].attr != (char *)0x0;
    }
    if (!bVar2) break;
    pcStack_28 = (char *)0x0;
    iVar1 = curl_easy_getinfo(_i,mappings[local_18].info,&stack0xffffffffffffffd8);
    if ((iVar1 == 0) && (pcStack_28 != (char *)0x0)) {
      local_2d = false;
      if (mappings[local_18].info == CURLINFO_EFFECTIVE_URL) {
        local_2d = stripcredentials(&stack0xffffffffffffffd8);
      }
      iVar1 = err;
      __value = pcStack_28;
      if (pcStack_28 != (char *)0x0) {
        __name = mappings[local_18].attr;
        __size = strlen(pcStack_28);
        value._4_4_ = fsetxattr(iVar1,__name,__value,__size,0);
        if (local_2d != false) {
          curl_free(pcStack_28);
        }
      }
    }
    local_18 = local_18 + 1;
  }
  return value._4_4_;
}

Assistant:

int fwrite_xattr(CURL *curl, int fd)
{
  int i = 0;
  int err = 0;

  /* loop through all xattr-curlinfo pairs and abort on a set error */
  while(err == 0 && mappings[i].attr != NULL) {
    char *value = NULL;
    CURLcode result = curl_easy_getinfo(curl, mappings[i].info, &value);
    if(!result && value) {
      bool freeptr = FALSE;
      if(CURLINFO_EFFECTIVE_URL == mappings[i].info)
        freeptr = stripcredentials(&value);
      if(value) {
#ifdef HAVE_FSETXATTR_6
        err = fsetxattr(fd, mappings[i].attr, value, strlen(value), 0, 0);
#elif defined(HAVE_FSETXATTR_5)
        err = fsetxattr(fd, mappings[i].attr, value, strlen(value), 0);
#elif defined(__FreeBSD_version)
        {
          ssize_t rc = extattr_set_fd(fd, EXTATTR_NAMESPACE_USER,
                                      mappings[i].attr, value, strlen(value));
          /* FreeBSD's extattr_set_fd returns the length of the extended
             attribute */
          err = (rc < 0 ? -1 : 0);
        }
#endif
        if(freeptr)
          curl_free(value);
      }
    }
    i++;
  }

  return err;
}